

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.cc
# Opt level: O3

double __thiscall Generator::MeanLogGuesses(Generator *this,char *puzzle)

{
  undefined1 auVar1 [16];
  int iVar2;
  ostream *poVar3;
  int iVar4;
  char *pcVar5;
  double dVar6;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  size_t guesses;
  char solution [81];
  size_t local_98;
  double local_90;
  char local_88 [88];
  
  iVar2 = (this->options_).num_evals;
  if (iVar2 < 1) {
    local_90 = 0.0;
  }
  else {
    local_90 = 0.0;
    iVar4 = 0;
    do {
      Util::PermuteSudoku(&this->util_,puzzle,(this->options_).pencilmark);
      local_98 = 0;
      iVar2 = (this->options_).solver;
      if (iVar2 == 2) {
        pcVar5 = "Must build with -DGUROBI=on to use gurobi";
LAB_00105192:
        poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar3);
        exit(1);
      }
      if (iVar2 == 1) {
        pcVar5 = "Must build with -DMINISAT=on to use minisat";
        goto LAB_00105192;
      }
      TdokuSolverDpllTriadSimd(puzzle,1,0,local_88,&local_98);
      auVar1._8_8_ = in_XMM2_Qb;
      auVar1._0_8_ = in_XMM2_Qa;
      auVar1 = vcvtusi2sd_avx512f(auVar1,local_98);
      dVar6 = log(auVar1._0_8_ + 1.0);
      iVar2 = (this->options_).num_evals;
      iVar4 = iVar4 + 1;
      local_90 = local_90 + dVar6;
    } while (iVar4 < iVar2);
  }
  return (double)((ulong)(iVar2 != 0) * (long)(local_90 / (double)iVar2));
}

Assistant:

double MeanLogGuesses(char *puzzle) {
        char solution[81];
        double sum_log_guesses = 0.0;
        for (int j = 0; j < options_.num_evals; j++) {
            util_.PermuteSudoku(puzzle, options_.pencilmark);
            size_t guesses = 0;
            if (options_.solver == 1) {
#ifdef MINISAT
                OtherSolverMiniSat(puzzle, 1, 3, solution, &guesses);
#else
                cout << "Must build with -DMINISAT=on to use minisat" << endl;
                exit(1);
#endif
            } else if (options_.solver == 2) {
#ifdef GUROBI
                OtherSolverGurobi(puzzle, 2, 0, solution, &guesses);
#else
                cout << "Must build with -DGUROBI=on to use gurobi" << endl;
                exit(1);
#endif
            } else {
                TdokuSolverDpllTriadSimd(puzzle, 1, 0, solution, &guesses);
            }
            sum_log_guesses += log((double) guesses + 1);
        }
        return options_.num_evals == 0 ? 0.0 : sum_log_guesses / options_.num_evals;
    }